

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_31::HeaderNameHash::operator()(HeaderNameHash *this,StringPtr a,StringPtr b)

{
  int iVar1;
  char *__s1;
  char *__s2;
  HeaderNameHash *this_local;
  StringPtr b_local;
  StringPtr a_local;
  
  b_local.content.ptr = (char *)b.content.size_;
  this_local = (HeaderNameHash *)b.content.ptr;
  b_local.content.size_ = (size_t)a.content.ptr;
  __s1 = StringPtr::cStr((StringPtr *)&b_local.content.size_);
  __s2 = StringPtr::cStr((StringPtr *)&this_local);
  iVar1 = strcasecmp(__s1,__s2);
  return iVar1 == 0;
}

Assistant:

bool operator()(kj::StringPtr a, kj::StringPtr b) const {
    // TODO(perf): I wonder if we can beat strcasecmp() by masking bit 0x20 from each byte. We'd
    //   need to prohibit one of the technically-legal characters '^' or '~' from header names
    //   since they'd otherwise be ambiguous, but otherwise there is no ambiguity.
#if _MSC_VER
    return _stricmp(a.cStr(), b.cStr()) == 0;
#else
    return strcasecmp(a.cStr(), b.cStr()) == 0;
#endif
  }